

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.c
# Opt level: O1

int vorbis_block_clear(vorbis_block *vb)

{
  void *__ptr;
  long lVar1;
  
  __ptr = vb->internal;
  _vorbis_block_ripcord(vb);
  if (vb->localstore != (void *)0x0) {
    free(vb->localstore);
  }
  if (__ptr != (void *)0x0) {
    lVar1 = 2;
    do {
      oggpack_writeclear(*(oggpack_buffer **)((long)__ptr + lVar1 * 8));
      if (lVar1 != 9) {
        free(*(void **)((long)__ptr + lVar1 * 8));
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x11);
    free(__ptr);
  }
  memset(vb,0,0xc0);
  return 0;
}

Assistant:

int vorbis_block_clear(vorbis_block *vb){
  int i;
  vorbis_block_internal *vbi=vb->internal;

  _vorbis_block_ripcord(vb);
  if(vb->localstore)_ogg_free(vb->localstore);

  if(vbi){
    for(i=0;i<PACKETBLOBS;i++){
      oggpack_writeclear(vbi->packetblob[i]);
      if(i!=PACKETBLOBS/2)_ogg_free(vbi->packetblob[i]);
    }
    _ogg_free(vbi);
  }
  memset(vb,0,sizeof(*vb));
  return(0);
}